

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O1

void cppurses::System::post_event<cppurses::Resize_event,cppurses::Widget&,cppurses::Area>
               (Widget *args,Area *args_1)

{
  size_t sVar1;
  size_t sVar2;
  pointer *__ptr;
  __uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_> local_18;
  
  local_18._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
  super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl =
       (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)operator_new(0x28);
  sVar1 = args_1->width;
  sVar2 = args_1->height;
  *(undefined4 *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
          super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 8) = 0xc;
  *(Widget **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
          super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 0x10) = args;
  *(undefined ***)
   local_18._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
   super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl = &PTR__Event_00166968;
  *(size_t *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
          super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 0x18) = sVar1;
  *(size_t *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
          super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 0x20) = sVar2;
  post_event((unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *)&local_18);
  if ((_Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
      local_18._M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
      .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl != (Event *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
                          .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

static void post_event(Args&&... args)
    {
        auto event = std::make_unique<T>(std::forward<Args>(args)...);
        System::post_event(std::move(event));
    }